

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O1

Matrix<int,_4UL,_4UL> __thiscall
Matrix<int,6ul,6ul>::conv<3ul,3ul>(Matrix<int,6ul,6ul> *this,Matrix<int,_3UL,_3UL> *kernel)

{
  long lVar1;
  undefined8 *puVar2;
  _Head_base<0UL,_std::array<int,_9UL>_*,_false> _Var3;
  long *in_RDX;
  int sum;
  int iVar4;
  long lVar5;
  int *piVar6;
  int j;
  long lVar7;
  int i_1;
  long lVar8;
  int *piVar9;
  long lVar10;
  int j_1;
  long lVar11;
  
  puVar2 = (undefined8 *)operator_new(0x40);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  _Var3._M_head_impl =
       (kernel->elements)._M_t.
       super___uniq_ptr_impl<std::array<int,_9UL>,_std::default_delete<std::array<int,_9UL>_>_>._M_t
       .super__Tuple_impl<0UL,_std::array<int,_9UL>_*,_std::default_delete<std::array<int,_9UL>_>_>.
       super__Head_base<0UL,_std::array<int,_9UL>_*,_false>._M_head_impl;
  lVar1 = *in_RDX;
  lVar5 = 0;
  do {
    lVar7 = 0;
    piVar6 = (_Var3._M_head_impl)->_M_elems;
    do {
      lVar8 = 0;
      iVar4 = 0;
      piVar9 = piVar6;
      lVar10 = lVar1;
      do {
        lVar11 = 0;
        do {
          iVar4 = iVar4 + *(int *)(lVar10 + lVar11 * 4) * piVar9[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 0xc;
        piVar9 = piVar9 + 6;
      } while (lVar8 != 3);
      *(int *)((long)puVar2 + (lVar7 + lVar5 * 4) * 4) = iVar4;
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + 1;
    } while (lVar7 != 4);
    lVar5 = lVar5 + 1;
    _Var3._M_head_impl = (array<int,_9UL> *)((long)_Var3._M_head_impl + 0x18);
  } while (lVar5 != 4);
  *(undefined8 **)this = puVar2;
  return (unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>)
         (unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>)this;
}

Assistant:

auto conv(const Matrix<T, KRow, KCol> &kernel) {
    static_assert(Row >= KRow and Col >= KCol, "kernel size miss matched");
    constexpr size_t nr = Row - KRow + 1, nc = Col - KCol + 1;
    Matrix<T, nr, nc> result;
    for (auto i = 0; i < nr; ++i) {
      for (auto j = 0; j < nc; ++j) {
        result.at(i, j) = conv_op(kernel, i, j);
      }
    }
    return result;
  }